

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O1

void __thiscall
cfd::api::json::ElementsDecodeRawTransactionTxOut::ConvertFromStruct
          (ElementsDecodeRawTransactionTxOut *this,ElementsDecodeRawTransactionTxOutStruct *data)

{
  int64_t iVar1;
  int iVar2;
  
  iVar1 = data->value_minimum;
  this->value_ = data->value;
  this->value_minimum_ = iVar1;
  this->value_maximum_ = data->value_maximum;
  iVar2 = data->ct_bits;
  this->ct_exponent_ = data->ct_exponent;
  this->ct_bits_ = iVar2;
  std::__cxx11::string::_M_assign((string *)&this->surjectionproof_);
  std::__cxx11::string::_M_assign((string *)&this->valuecommitment_);
  std::__cxx11::string::_M_assign((string *)&this->asset_);
  std::__cxx11::string::_M_assign((string *)&this->assetcommitment_);
  std::__cxx11::string::_M_assign((string *)&this->commitmentnonce_);
  this->commitmentnonce_fully_valid_ = data->commitmentnonce_fully_valid;
  this->n_ = data->n;
  ElementsDecodeLockingScript::ConvertFromStruct(&this->script_pub_key_,&data->script_pub_key);
  std::__cxx11::string::_M_assign((string *)&this->rangeproof_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void ElementsDecodeRawTransactionTxOut::ConvertFromStruct(
    const ElementsDecodeRawTransactionTxOutStruct& data) {
  value_ = data.value;
  value_minimum_ = data.value_minimum;
  value_maximum_ = data.value_maximum;
  ct_exponent_ = data.ct_exponent;
  ct_bits_ = data.ct_bits;
  surjectionproof_ = data.surjectionproof;
  valuecommitment_ = data.valuecommitment;
  asset_ = data.asset;
  assetcommitment_ = data.assetcommitment;
  commitmentnonce_ = data.commitmentnonce;
  commitmentnonce_fully_valid_ = data.commitmentnonce_fully_valid;
  n_ = data.n;
  script_pub_key_.ConvertFromStruct(data.script_pub_key);
  rangeproof_ = data.rangeproof;
  ignore_items = data.ignore_items;
}